

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O3

void __thiscall Am_Priority_List::Print(Am_Priority_List *this,ostream *os)

{
  ostream *poVar1;
  Am_Priority_List_Item *current;
  Am_Value v;
  Am_Value local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"PRIORITY_LIST(",0xe);
  poVar1 = (ostream *)std::ostream::operator<<(os,(uint)this->number);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  for (current = this->head; current != this->tail; current = current->next) {
    print_current(os,current);
  }
  if (current != (Am_Priority_List_Item *)0x0) {
    print_current(os,current);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  Am_Value::~Am_Value(&local_28);
  return;
}

Assistant:

void
Am_Priority_List::Print(std::ostream &os) const
{
  Am_Priority_List_Item *current;
  os << "PRIORITY_LIST(" << (int)number << ") [";
  Am_Value v;
  for (current = head; current != tail; current = current->next) {
    print_current(os, current);
  }
  if (current) {
    print_current(os, current);
  }
  os << "]";
}